

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VRMath.cpp
# Opt level: O2

ostream * MinVR::operator<<(ostream *os,VRMatrix4 *m)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"[[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[0]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[4]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[8]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[0xc]);
  poVar1 = std::operator<<(poVar1,"], ");
  poVar1 = std::operator<<(poVar1,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[1]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[5]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[9]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[0xd]);
  poVar1 = std::operator<<(poVar1,"], ");
  poVar1 = std::operator<<(poVar1,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[2]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[6]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[10]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[0xe]);
  poVar1 = std::operator<<(poVar1,"], ");
  poVar1 = std::operator<<(poVar1,"[");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[3]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[7]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[0xb]);
  poVar1 = std::operator<<(poVar1,", ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,m->m[0xf]);
  poVar1 = std::operator<<(poVar1,"]]");
  return poVar1;
}

Assistant:

std::ostream & operator<< ( std::ostream &os, const VRMatrix4 &m) {
  // format:  ((r1c1, r1c2, r1c3, r1c4), (r2c1, r2c2, r2c3, r2c4), etc.. )
  return os << "[[" << m(0,0) << ", " << m(0,1) << ", " << m(0,2) << ", " << m(0,3) << "], "
        << "[" << m(1,0) << ", " << m(1,1) << ", " << m(1,2) << ", " << m(1,3) << "], "
        << "[" << m(2,0) << ", " << m(2,1) << ", " << m(2,2) << ", " << m(2,3) << "], "
        << "[" << m(3,0) << ", " << m(3,1) << ", " << m(3,2) << ", " << m(3,3) << "]]";
}